

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

bool anon_unknown.dwarf_7f0079::DeduceVersionProfile
               (TInfoSink *infoSink,EShLanguage stage,bool versionNotFirst,int defaultVersion,
               EShSource source,int *version,EProfile *profile,SpvVersion *spvVersion)

{
  int iVar1;
  int iVar2;
  char *s;
  EProfile EVar3;
  bool bVar4;
  
  if (source == EShSourceHlsl) {
    *version = 500;
    *profile = ECoreProfile;
    return true;
  }
  iVar1 = *version;
  if (*version == 0) {
    *version = defaultVersion;
    iVar1 = defaultVersion;
  }
  EVar3 = *profile;
  if (EVar3 == ENoProfile) {
    if ((iVar1 - 300U < 0x15) && ((0x100401U >> (iVar1 - 300U & 0x1f) & 1) != 0)) {
      s = "#version: versions 300, 310, and 320 require specifying the \'es\' profile";
LAB_002e6cc8:
      glslang::TInfoSinkBase::message(&infoSink->info,EPrefixError,s);
      bVar4 = false;
LAB_002e6cd6:
      *profile = EEsProfile;
      iVar1 = *version;
      EVar3 = EEsProfile;
      goto LAB_002e6d61;
    }
    if (iVar1 != 100) {
      if (iVar1 < 0x96) {
        *profile = ENoProfile;
        bVar4 = true;
        EVar3 = ENoProfile;
      }
      else {
        *profile = ECoreProfile;
        bVar4 = true;
        EVar3 = ECoreProfile;
      }
      goto LAB_002e6d61;
    }
    *profile = EEsProfile;
    EVar3 = EEsProfile;
    bVar4 = true;
  }
  else if (iVar1 < 0x96) {
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: versions before 150 do not allow a profile token");
    iVar1 = *version;
    if (iVar1 != 100) {
      *profile = ENoProfile;
      EVar3 = ENoProfile;
LAB_002e6d03:
      bVar4 = false;
      goto LAB_002e6d61;
    }
    *profile = EEsProfile;
LAB_002e6c97:
    bVar4 = false;
    EVar3 = EEsProfile;
  }
  else {
    if ((iVar1 - 300U < 0x15) && ((0x100401U >> (iVar1 - 300U & 0x1f) & 1) != 0)) {
      bVar4 = true;
      if (EVar3 != EEsProfile) {
        s = "#version: versions 300, 310, and 320 support only the es profile";
        goto LAB_002e6cc8;
      }
      goto LAB_002e6cd6;
    }
    bVar4 = true;
    if (EVar3 == EEsProfile) {
      EVar3 = ECoreProfile;
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixError,
                 "#version: only version 300, 310, and 320 support the es profile");
      iVar1 = *version;
      if (0x95 < iVar1) {
        *profile = ECoreProfile;
        goto LAB_002e6d03;
      }
      *profile = ENoProfile;
      bVar4 = false;
      EVar3 = ENoProfile;
    }
LAB_002e6d61:
    if ((((0x3c < iVar1 - 400U) ||
         ((0x1004010040100401U >> ((ulong)(iVar1 - 400U) & 0x3f) & 1) == 0)) &&
        ((0x32 < iVar1 - 100U || ((0x4010040100401U >> ((ulong)(iVar1 - 100U) & 0x3f) & 1) == 0))))
       && ((0x1e < iVar1 - 300U || ((0x40100401U >> (iVar1 - 300U & 0x1f) & 1) == 0)))) {
      EVar3 = ECoreProfile;
      glslang::TInfoSinkBase::message(&infoSink->info,EPrefixError,"version not supported");
      if (*profile == EEsProfile) {
        *version = 0x136;
        goto LAB_002e6c97;
      }
      *version = 0x1c2;
      *profile = ECoreProfile;
      bVar4 = false;
    }
  }
  switch(stage) {
  case EShLangTessControl:
  case EShLangTessEvaluation:
    if ((EVar3 != EEsProfile || 0x135 < *version) && (0x95 < *version || EVar3 == EEsProfile))
    goto switchD_002e6dee_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: tessellation shaders require es profile with version 310 or non-es profile with version 150 or above"
              );
    EVar3 = *profile;
    iVar1 = 400;
    break;
  case EShLangGeometry:
    if ((EVar3 != EEsProfile || 0x135 < *version) && (0x95 < *version || EVar3 == EEsProfile))
    goto switchD_002e6dee_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: geometry shaders require es profile with version 310 or non-es profile with version 150 or above"
              );
    EVar3 = *profile;
    iVar1 = 0x96;
    break;
  default:
    goto switchD_002e6dee_caseD_4;
  case EShLangCompute:
    if ((EVar3 != EEsProfile || 0x135 < *version) && (0x1a3 < *version || EVar3 == EEsProfile))
    goto switchD_002e6dee_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: compute shaders require es profile with version 310 or above, or non-es profile with version 420 or above"
              );
    EVar3 = *profile;
    iVar2 = 0x136;
    iVar1 = 0x1a4;
    goto LAB_002e6f88;
  case EShLangRayGen:
  case EShLangIntersect:
  case EShLangAnyHit:
  case EShLangClosestHit:
  case EShLangMiss:
  case EShLangCallable:
    if ((EVar3 != EEsProfile) && (0x1cb < *version)) goto switchD_002e6dee_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: ray tracing shaders require non-es profile with version 460 or above");
    *version = 0x1cc;
    EVar3 = *profile;
    goto LAB_002e6f8d;
  case EShLangTask:
  case EShLangMesh:
    if ((EVar3 != EEsProfile || 0x13f < *version) && (0x1c1 < *version || EVar3 == EEsProfile))
    goto switchD_002e6dee_caseD_4;
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: mesh/task shaders require es profile with version 320 or above, or non-es profile with version 450 or above"
              );
    EVar3 = *profile;
    iVar2 = 0x140;
    iVar1 = 0x1c2;
LAB_002e6f88:
    if (EVar3 == EEsProfile) {
      iVar1 = iVar2;
    }
    *version = iVar1;
    goto LAB_002e6f8d;
  }
  if (EVar3 == EEsProfile) {
    iVar1 = 0x136;
  }
  *version = iVar1;
  if ((EVar3 == EEsProfile) || (EVar3 == ENoProfile)) {
    *profile = ECoreProfile;
    EVar3 = ECoreProfile;
LAB_002e6f8d:
    bVar4 = false;
  }
  else {
    bVar4 = false;
  }
switchD_002e6dee_caseD_4:
  if ((EVar3 == EEsProfile && versionNotFirst) && 299 < *version) {
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixError,
               "#version: statement must appear first in es-profile shader; before comments or newlines"
              );
    bVar4 = false;
  }
  if (spvVersion->spv != 0) {
    if (*profile == ECompatibilityProfile) {
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixError,
                 "#version: compilation for SPIR-V does not support the compatibility profile");
    }
    else {
      if (*profile == EEsProfile) {
        if (0x135 < *version) {
          return bVar4;
        }
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: ES shaders for SPIR-V require version 310 or higher");
        *version = 0x136;
      }
      else {
        iVar1 = *version;
        if (iVar1 < 0x8c && 0 < spvVersion->vulkan) {
          glslang::TInfoSinkBase::message
                    (&infoSink->info,EPrefixError,
                     "#version: Desktop shaders for Vulkan SPIR-V require version 140 or higher");
          *version = 0x8c;
          iVar1 = 0x8c;
          bVar4 = false;
        }
        if (0x149 < iVar1 || spvVersion->openGl < 100) {
          return bVar4;
        }
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: Desktop shaders for OpenGL SPIR-V require version 330 or higher");
        *version = 0x14a;
      }
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool DeduceVersionProfile(TInfoSink& infoSink, EShLanguage stage, bool versionNotFirst, int defaultVersion,
                          EShSource source, int& version, EProfile& profile, const SpvVersion& spvVersion)
{
    const int FirstProfileVersion = 150;
    bool correct = true;

    if (source == EShSourceHlsl) {
        version = 500;          // shader model; currently a characteristic of glslang, not the input
        profile = ECoreProfile; // allow doubles in prototype parsing
        return correct;
    }

    // Get a version...
    if (version == 0) {
        version = defaultVersion;
        // infoSink.info.message(EPrefixWarning, "#version: statement missing; use #version on first line of shader");
    }

    // Get a good profile...
    if (profile == ENoProfile) {
        if (version == 300 || version == 310 || version == 320) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: versions 300, 310, and 320 require specifying the 'es' profile");
            profile = EEsProfile;
        } else if (version == 100)
            profile = EEsProfile;
        else if (version >= FirstProfileVersion)
            profile = ECoreProfile;
        else
            profile = ENoProfile;
    } else {
        // a profile was provided...
        if (version < 150) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: versions before 150 do not allow a profile token");
            if (version == 100)
                profile = EEsProfile;
            else
                profile = ENoProfile;
        } else if (version == 300 || version == 310 || version == 320) {
            if (profile != EEsProfile) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: versions 300, 310, and 320 support only the es profile");
            }
            profile = EEsProfile;
        } else {
            if (profile == EEsProfile) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: only version 300, 310, and 320 support the es profile");
                if (version >= FirstProfileVersion)
                    profile = ECoreProfile;
                else
                    profile = ENoProfile;
            }
            // else: typical desktop case... e.g., "#version 410 core"
        }
    }

    // Fix version...
    switch (version) {
    // ES versions
    case 100: break;
    case 300: break;
    case 310: break;
    case 320: break;

    // desktop versions
    case 110: break;
    case 120: break;
    case 130: break;
    case 140: break;
    case 150: break;
    case 330: break;
    case 400: break;
    case 410: break;
    case 420: break;
    case 430: break;
    case 440: break;
    case 450: break;
    case 460: break;

    // unknown version
    default:
        correct = false;
        infoSink.info.message(EPrefixError, "version not supported");
        if (profile == EEsProfile)
            version = 310;
        else {
            version = 450;
            profile = ECoreProfile;
        }
        break;
    }

    // Correct for stage type...
    switch (stage) {
    case EShLangGeometry:
        if ((profile == EEsProfile && version < 310) ||
            (profile != EEsProfile && version < 150)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: geometry shaders require es profile with version 310 or non-es profile with version 150 or above");
            version = (profile == EEsProfile) ? 310 : 150;
            if (profile == EEsProfile || profile == ENoProfile)
                profile = ECoreProfile;
        }
        break;
    case EShLangTessControl:
    case EShLangTessEvaluation:
        if ((profile == EEsProfile && version < 310) ||
            (profile != EEsProfile && version < 150)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: tessellation shaders require es profile with version 310 or non-es profile with version 150 or above");
            version = (profile == EEsProfile) ? 310 : 400; // 150 supports the extension, correction is to 400 which does not
            if (profile == EEsProfile || profile == ENoProfile)
                profile = ECoreProfile;
        }
        break;
    case EShLangCompute:
        if ((profile == EEsProfile && version < 310) ||
            (profile != EEsProfile && version < 420)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: compute shaders require es profile with version 310 or above, or non-es profile with version 420 or above");
            version = profile == EEsProfile ? 310 : 420;
        }
        break;
    case EShLangRayGen:
    case EShLangIntersect:
    case EShLangAnyHit:
    case EShLangClosestHit:
    case EShLangMiss:
    case EShLangCallable:
        if (profile == EEsProfile || version < 460) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: ray tracing shaders require non-es profile with version 460 or above");
            version = 460;
        }
        break;
    case EShLangMesh:
    case EShLangTask:
        if ((profile == EEsProfile && version < 320) ||
            (profile != EEsProfile && version < 450)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: mesh/task shaders require es profile with version 320 or above, or non-es profile with version 450 or above");
            version = profile == EEsProfile ? 320 : 450;
        }
        break;
    default:
        break;
    }

    if (profile == EEsProfile && version >= 300 && versionNotFirst) {
        correct = false;
        infoSink.info.message(EPrefixError, "#version: statement must appear first in es-profile shader; before comments or newlines");
    }

    // Check for SPIR-V compatibility
    if (spvVersion.spv != 0) {
        switch (profile) {
        case EEsProfile:
            if (version < 310) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: ES shaders for SPIR-V require version 310 or higher");
                version = 310;
            }
            break;
        case ECompatibilityProfile:
            infoSink.info.message(EPrefixError, "#version: compilation for SPIR-V does not support the compatibility profile");
            break;
        default:
            if (spvVersion.vulkan > 0 && version < 140) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: Desktop shaders for Vulkan SPIR-V require version 140 or higher");
                version = 140;
            }
            if (spvVersion.openGl >= 100 && version < 330) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: Desktop shaders for OpenGL SPIR-V require version 330 or higher");
                version = 330;
            }
            break;
        }
    }

    return correct;
}